

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

With * sqlite3WithDup(sqlite3 *db,With *p)

{
  sqlite3 *db_00;
  Select *pSVar1;
  ExprList *pEVar2;
  char *pcVar3;
  int *in_RSI;
  int i;
  sqlite3_int64 nByte;
  With *pRet;
  sqlite3 *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar4;
  sqlite3 *db_01;
  
  db_01 = (sqlite3 *)0x0;
  if (in_RSI != (int *)0x0) {
    db_00 = (sqlite3 *)((long)(*in_RSI + -1) * 0x30 + 0x40);
    db_01 = (sqlite3 *)
            sqlite3DbMallocZero(db_00,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
    ;
    if (db_01 != (sqlite3 *)0x0) {
      *(int *)&db_01->pVfs = *in_RSI;
      for (iVar4 = 0; iVar4 < *in_RSI; iVar4 = iVar4 + 1) {
        pSVar1 = sqlite3SelectDup((sqlite3 *)pRet,(Select *)nByte,i);
        *(Select **)(db_01->aLimit + (long)iVar4 * 0xc + -0x1a) = pSVar1;
        pEVar2 = sqlite3ExprListDup(in_stack_00000028,(ExprList *)db,p._4_4_);
        *(ExprList **)(db_01->aLimit + (long)iVar4 * 0xc + -0x1c) = pEVar2;
        pcVar3 = sqlite3DbStrDup(db_01,(char *)db_00);
        *(char **)(db_01->aLimit + (long)iVar4 * 0xc + -0x1e) = pcVar3;
        *(char *)(db_01->aLimit + (long)iVar4 * 0xc + -0x14) = (char)in_RSI[(long)iVar4 * 0xc + 0xe]
        ;
      }
    }
  }
  return (With *)db_01;
}

Assistant:

SQLITE_PRIVATE With *sqlite3WithDup(sqlite3 *db, With *p){
  With *pRet = 0;
  if( p ){
    sqlite3_int64 nByte = sizeof(*p) + sizeof(p->a[0]) * (p->nCte-1);
    pRet = sqlite3DbMallocZero(db, nByte);
    if( pRet ){
      int i;
      pRet->nCte = p->nCte;
      for(i=0; i<p->nCte; i++){
        pRet->a[i].pSelect = sqlite3SelectDup(db, p->a[i].pSelect, 0);
        pRet->a[i].pCols = sqlite3ExprListDup(db, p->a[i].pCols, 0);
        pRet->a[i].zName = sqlite3DbStrDup(db, p->a[i].zName);
        pRet->a[i].eM10d = p->a[i].eM10d;
      }
    }
  }
  return pRet;
}